

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra> *this)

{
  long lVar1;
  
  (this->super_TPZGeoEl).fMesh = (TPZGeoMesh *)0x0;
  (this->super_TPZGeoEl).fId = -1;
  (this->super_TPZGeoEl).fMatId = 0;
  (this->super_TPZGeoEl).fReference = (TPZCompEl *)0x0;
  *(undefined4 *)&(this->super_TPZGeoEl).fFatherIndex = 0xffffffff;
  *(undefined4 *)((long)&(this->super_TPZGeoEl).fFatherIndex + 4) = 0xffffffff;
  *(undefined4 *)&(this->super_TPZGeoEl).fIndex = 0xffffffff;
  *(undefined4 *)((long)&(this->super_TPZGeoEl).fIndex + 4) = 0xffffffff;
  (this->super_TPZGeoEl).fNumInterfaces = 0;
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018ae438;
  *(undefined4 *)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + 4) =
       0xffffffff;
  *(undefined4 *)((this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + 1) =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + 0xc) =
       0xffffffff;
  *(undefined4 *)((this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + 2) =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + 0x14) =
       0xffffffff;
  *(undefined4 *)((this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + 3) =
       0xffffffff;
  *(undefined4 *)
   ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + 0x1c) =
       0xffffffff;
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.super_TPZTetrahedron.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoTetrahedra_018b5510;
  lVar1 = 0x78;
  do {
    *(undefined ***)((long)(&this->fGeo + -2) + lVar1) = &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x50) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1e0);
  lVar1 = 0x78;
  do {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x50) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1e0);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}